

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::
genTessellationControlSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  ostringstream buf;
  undefined1 local_1a0 [376];
  
  bVar1 = *(byte *)((long)this + 0x81);
  cVar2 = *(char *)((long)this + 0xd8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${PRIMITIVE_BOUNDING_BOX_REQUIRE}\n"
             ,0x56);
  pcVar5 = "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
  if ((bVar1 & 1) != 0) {
    pcVar5 = glcts::fixed_sample_locations_values + 1;
  }
  if (cVar2 == '\0') {
    pcVar5 = glcts::fixed_sample_locations_values + 1;
  }
  sVar3 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "layout(vertices=1) out;\nin highp vec4 vtx_color[];\nout highp vec4 tess_ctrl_color[];\nuniform highp float u_tessellationLevel;\nuniform highp vec4 u_posScale;\n"
             ,0x9d);
  if (*(char *)((long)this + 0x83) == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "uniform highp vec4 u_primitiveBBoxMin;\nuniform highp vec4 u_primitiveBBoxMax;\n",
               0x4e);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "patch out highp vec3 vp_bbox_clipMin;\npatch out highp vec3 vp_bbox_clipMax;\n",0x4c);
  if (*(char *)((long)this + 0x83) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    if (*(char *)((long)this + 0x81) == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,
                 "vec4 mirrorX(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(2.0 * patternCenter.x - p.x, p.y, p.z, p.w);\n}\n"
                 ,0xf1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "vec4 mirrorY(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(p.x, 2.0 * patternCenter.y - p.y, p.z, p.w);\n}\n"
               ,0xf1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"vec4 transformVec(in highp vec4 p)\n{\n\treturn ",0x2d);
    pcVar5 = "mirrorY(p)";
    if ((ulong)*(byte *)((long)this + 0x81) != 0) {
      pcVar5 = "mirrorX(mirrorY(p))";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,pcVar5,(ulong)*(byte *)((long)this + 0x81) * 9 + 10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,";\n}\n",4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "\nvoid main()\n{\n\t// convert to nonsensical coordinates, just in case\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position.wzxy;\n\ttess_ctrl_color[gl_InvocationID] = vtx_color[gl_InvocationID];\n\n\tgl_TessLevelOuter[0] = u_tessellationLevel;\n\tgl_TessLevelOuter[1] = u_tessellationLevel;\n\tgl_TessLevelOuter[2] = u_tessellationLevel;\n\tgl_TessLevelOuter[3] = u_tessellationLevel;\n\tgl_TessLevelInner[0] = 0.8; // will be rounded up to 1\n\tgl_TessLevelInner[1] = 0.8; // will be rounded up to 1\n"
             ,0x1f9);
  if (*(char *)((long)this + 0x83) == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\n",1);
    pcVar5 = 
    "\tconst vec2 minExpansion = vec2(0.07, 0.07); // eval shader\n\tconst vec2 maxExpansion = vec2(0.07, 0.07); // eval shader\n"
    ;
    bVar6 = *(char *)((long)this + 0x81) != '\0';
    if (bVar6) {
      pcVar5 = 
      "\tconst vec2 minExpansion = vec2(0.07 + 0.05, 0.07 + 0.02); // eval and geometry shader\n\tconst vec2 maxExpansion = vec2(0.07 + 0.05, 0.07 + 0.03); // eval and geometry shader\n"
      ;
    }
    lVar4 = 0x78;
    if (bVar6) {
      lVar4 = 0xae;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,lVar4);
    lVar4 = 0xfa;
    pcVar5 = 
    "\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec4 bboxMin = transformVec(gl_in[0].gl_Position) - vec4(minExpansion * patternScale, 0.0, 0.0);\n\thighp vec4 bboxMax = transformVec(gl_in[0].gl_Position) + vec4(maxExpansion * patternScale, 0.0, 0.0);\n"
    ;
  }
  else {
    lVar4 = 0x55;
    pcVar5 = 
    "\n\thighp vec4 bboxMin = u_primitiveBBoxMin;\n\thighp vec4 bboxMax = u_primitiveBBoxMax;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,lVar4);
  if (*(char *)((long)this + 0x82) == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "\n\t${PRIM_GL_BOUNDING_BOX}[0] = bboxMin;\n\t${PRIM_GL_BOUNDING_BOX}[1] = bboxMax;\n"
               ,0x4f);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "\tvp_bbox_clipMin = min(vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMin.w,\n\t                      vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMax.w);\n\tvp_bbox_clipMax = max(vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMin.w,\n\t                      vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMax.w);\n}\n"
             ,300);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genTessellationControlSource (void) const
{
	const bool			tessellationWidePoints = (m_isWidePointCase) && (!m_hasGeometryStage);
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
			"${PRIMITIVE_BOUNDING_BOX_REQUIRE}\n"
		<<	((tessellationWidePoints) ? ("${TESSELLATION_POINT_SIZE_REQUIRE}\n") : (""))
		<<	"layout(vertices=1) out;"
			"\n"
			"in highp vec4 vtx_color[];\n"
			"out highp vec4 tess_ctrl_color[];\n"
			"uniform highp float u_tessellationLevel;\n"
			"uniform highp vec4 u_posScale;\n";

	if (!m_calcPerPrimitiveBBox)
	{
		buf <<	"uniform highp vec4 u_primitiveBBoxMin;\n"
				"uniform highp vec4 u_primitiveBBoxMax;\n";
	}

	buf <<	"patch out highp vec3 vp_bbox_clipMin;\n"
			"patch out highp vec3 vp_bbox_clipMax;\n";

	if (m_calcPerPrimitiveBBox)
	{
		buf <<	"\n";
		if (m_hasGeometryStage)
			buf << genShaderFunction(SHADER_FUNC_MIRROR_X);
		buf << genShaderFunction(SHADER_FUNC_MIRROR_Y);

		buf <<	"vec4 transformVec(in highp vec4 p)\n"
				"{\n"
				"	return " << ((m_hasGeometryStage) ? ("mirrorX(mirrorY(p))") : ("mirrorY(p)")) << ";\n"
				"}\n";
	}

	buf <<	"\n"
			"void main()\n"
			"{\n"
			"	// convert to nonsensical coordinates, just in case\n"
			"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position.wzxy;\n"
			"	tess_ctrl_color[gl_InvocationID] = vtx_color[gl_InvocationID];\n"
			"\n"
			"	gl_TessLevelOuter[0] = u_tessellationLevel;\n"
			"	gl_TessLevelOuter[1] = u_tessellationLevel;\n"
			"	gl_TessLevelOuter[2] = u_tessellationLevel;\n"
			"	gl_TessLevelOuter[3] = u_tessellationLevel;\n"
			"	gl_TessLevelInner[0] = 0.8; // will be rounded up to 1\n"
			"	gl_TessLevelInner[1] = 0.8; // will be rounded up to 1\n";

	if (m_calcPerPrimitiveBBox)
	{
		buf <<	"\n";

		if (m_hasGeometryStage)
			buf <<	"	const vec2 minExpansion = vec2(0.07 + 0.05, 0.07 + 0.02); // eval and geometry shader\n"
					"	const vec2 maxExpansion = vec2(0.07 + 0.05, 0.07 + 0.03); // eval and geometry shader\n";
		else
			buf <<	"	const vec2 minExpansion = vec2(0.07, 0.07); // eval shader\n"
					"	const vec2 maxExpansion = vec2(0.07, 0.07); // eval shader\n";

		buf <<	"	highp vec2 patternScale = u_posScale.zw;\n"
				"	highp vec4 bboxMin = transformVec(gl_in[0].gl_Position) - vec4(minExpansion * patternScale, 0.0, 0.0);\n"
				"	highp vec4 bboxMax = transformVec(gl_in[0].gl_Position) + vec4(maxExpansion * patternScale, 0.0, 0.0);\n";
	}
	else
	{
		buf <<	"\n"
				"	highp vec4 bboxMin = u_primitiveBBoxMin;\n"
				"	highp vec4 bboxMax = u_primitiveBBoxMax;\n";
	}
	if (!m_useGlobalState)
		buf <<	"\n"
				"	${PRIM_GL_BOUNDING_BOX}[0] = bboxMin;\n"
				"	${PRIM_GL_BOUNDING_BOX}[1] = bboxMax;\n";

	buf <<	"	vp_bbox_clipMin = min(vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMin.w,\n"
			"	                      vec3(bboxMin.x, bboxMin.y, bboxMin.z) / bboxMax.w);\n"
			"	vp_bbox_clipMax = max(vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMin.w,\n"
			"	                      vec3(bboxMax.x, bboxMax.y, bboxMax.z) / bboxMax.w);\n"
			"}\n";

	return buf.str();
}